

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v8::vprint(FILE *f,string_view format_str,format_args args)

{
  size_t sVar1;
  string_view text;
  memory_buffer buffer;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_220;
  
  local_220.super_buffer<char>.ptr_ = local_220.store_;
  local_220.super_buffer<char>.size_ = 0;
  local_220.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0015c4c0;
  local_220.super_buffer<char>.capacity_ = 500;
  sVar1 = args.desc_;
  detail::vformat_to<char>(&local_220.super_buffer<char>,format_str,args,(locale_ref)0x0);
  text.size_ = sVar1;
  text.data_ = (char *)local_220.super_buffer<char>.size_;
  detail::print((detail *)f,(FILE *)local_220.super_buffer<char>.ptr_,text);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::deallocate(&local_220);
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::print(f, {buffer.data(), buffer.size()});
}